

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O2

SUNErrCode SUNLinSolSpace_SPFGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long lVar1;
  long lVar2;
  sunindextype lrw1;
  sunindextype liw1;
  long local_38;
  long local_30;
  
  lVar2 = (long)*S->content;
  lVar1 = *(long *)((long)S->content + 0x90);
  if (*(long *)(*(long *)(lVar1 + 8) + 0x20) == 0) {
    local_30 = 0;
    local_38 = 0;
  }
  else {
    N_VSpace(lVar1,&local_38,&local_30);
  }
  lVar1 = lVar2 * 2 + 4;
  *lenrwLS = local_38 * lVar1 + (lVar2 + 5) * lVar2 + 2;
  *leniwLS = local_30 * lVar1;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_SPFGMR(SUNLinearSolver S, long int* lenrwLS,
                                 long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPFGMR_CONTENT(S)->maxl;
  if (SPFGMR_CONTENT(S)->vtemp->ops->nvspace)
  {
    N_VSpace(SPFGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
    SUNCheckLastErr();
  }
  else { lrw1 = liw1 = 0; }
  *lenrwLS = lrw1 * (2 * maxl + 4) + maxl * (maxl + 5) + 2;
  *leniwLS = liw1 * (2 * maxl + 4);
  return SUN_SUCCESS;
}